

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<unsigned_int>::data(QList<unsigned_int> *this)

{
  QArrayDataPointer<unsigned_int> *this_00;
  uint *puVar1;
  QArrayDataPointer<unsigned_int> *in_RDI;
  
  detach((QList<unsigned_int> *)0x2036ac);
  this_00 = (QArrayDataPointer<unsigned_int> *)QArrayDataPointer<unsigned_int>::operator->(in_RDI);
  puVar1 = QArrayDataPointer<unsigned_int>::data(this_00);
  return puVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }